

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  code *pcVar2;
  long lVar3;
  long *__nptr;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  undefined8 uVar7;
  thread *t;
  long lVar8;
  long lVar9;
  char___0_ *__range1_1;
  long lVar10;
  thread (*__range1) [33299];
  void *__s;
  ulong uVar11;
  long lStack_1a0;
  long lStack_198;
  undefined1 local_190 [8];
  Database tpch;
  char **argv_local;
  long *local_70 [2];
  long local_60 [2];
  ulong local_50;
  long *local_48;
  ulong local_40;
  uint local_38;
  int local_34;
  int round;
  int thread_num;
  
  lStack_1a0 = 0x10399f;
  tpch._264_8_ = argv;
  mkdir(DATA_PATH_abi_cxx11_._M_dataplus._M_p,0x1ff);
  tpch.a_lineitemposition[4]._0_1_ = '\0';
  lStack_1a0 = 0x1039be;
  Database::importDB((Database *)local_190,argv[1],argv[2],argv[3]);
  lStack_1a0 = 0x1039cf;
  std::__cxx11::string::string((string *)local_70,argv[4],(allocator *)&local_34);
  __nptr = local_70[0];
  lStack_1a0 = 0x1039d8;
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  lStack_1a0 = 0x1039f8;
  uVar6 = strtol((char *)__nptr,(char **)&local_48,10);
  if (local_48 == __nptr) {
    lStack_1a0 = 0x103bd4;
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar4 = (uint)uVar6;
    if (((long)(int)uVar4 == uVar6) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = iVar1;
      }
      if (local_70[0] != local_60) {
        lStack_1a0 = 0x103a3c;
        operator_delete(local_70[0],local_60[0] + 1);
      }
      uVar11 = 0x10;
      if ((int)uVar4 < 0x10) {
        uVar11 = uVar6 & 0xffffffff;
      }
      local_38 = uVar4;
      local_34 = (int)uVar11;
      lVar3 = -(uVar11 * 8 + 0xf & 0xfffffffffffffff0);
      __s = (void *)((long)&lStack_198 + lVar3);
      local_40 = uVar6;
      if (uVar4 != 0) {
        *(undefined8 *)((long)&lStack_1a0 + lVar3) = 0x103a86;
        memset(__s,0,uVar11 * 8);
      }
      local_50 = (ulong)local_38;
      lVar10 = (long)__s - ((ulong)local_38 * 8 + 0xf & 0xfffffffffffffff0);
      if (0 < local_34) {
        lVar8 = 0;
        do {
          local_48 = (long *)0x0;
          *(undefined8 *)(lVar10 + -8) = 0x103ac7;
          local_70[0] = (long *)operator_new(0x40);
          *local_70[0] = (long)&PTR___State_00107d48;
          *(int *)(local_70[0] + 1) = (int)lVar8;
          local_70[0][2] = (long)&local_38;
          local_70[0][3] = (long)&local_34;
          local_70[0][4] = (long)&tpch.pending;
          local_70[0][5] = local_50;
          local_70[0][6] = lVar10;
          local_70[0][7] = (long)local_190;
          *(undefined8 *)(lVar10 + -8) = 0x103b0f;
          std::thread::_M_start_thread(&local_48,local_70,0);
          if (local_70[0] != (long *)0x0) {
            pcVar2 = *(code **)(*local_70[0] + 8);
            *(undefined8 *)(lVar10 + -8) = 0x103b1e;
            (*pcVar2)();
          }
          if (*(long *)((long)__s + lVar8 * 8) != 0) goto LAB_00103c50;
          *(long **)((long)__s + lVar8 * 8) = local_48;
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_34);
      }
      if ((int)local_40 != 0) {
        lVar8 = uVar11 * 8;
        do {
          *(undefined8 *)(lVar10 + -8) = 0x103b5a;
          std::thread::join();
          lVar8 = lVar8 + -8;
        } while (lVar8 != 0);
      }
      if (local_50 != 0) {
        lVar8 = local_50 << 3;
        lVar9 = 0;
        do {
          uVar7 = *(undefined8 *)(lVar10 + lVar9);
          *(undefined8 *)(lVar10 + -8) = 0x103b87;
          printf("%s",uVar7);
          lVar9 = lVar9 + 8;
        } while (lVar8 != lVar9);
      }
      if ((int)local_40 != 0) {
        lVar8 = uVar11 << 3;
        do {
          if (*(long *)((long)&lStack_1a0 + lVar8 + lVar3) != 0) {
LAB_00103c50:
            *(undefined8 *)(lVar10 + -8) = 0x103c55;
            std::terminate();
          }
          lVar8 = lVar8 + -8;
        } while (lVar8 != 0);
      }
      do {
      } while ((char)tpch.a_lineitemposition[4] != '\0');
      return 0;
    }
  }
  lStack_1a0 = 0x103be0;
  uVar7 = std::__throw_out_of_range("stoi");
  do {
  } while ((char)tpch.a_lineitemposition[4] != '\0');
  lStack_1a0 = 0x103c50;
  _Unwind_Resume(uVar7);
}

Assistant:

int main(int argc, char* argv[]) {

  mkdir(DATA_PATH.c_str(), 0777);

  Database tpch;

  // load
  tpch.importDB(argv[1], argv[2], argv[3]);

  auto round = std::stoi(argv[4]);
  auto thread_num = std::min(MAX_CORE_NUM, round);
  std::thread threads[thread_num];
  char* results[round];

  // query
  for (int i = 0; i < thread_num; i++) {
    threads[i] = std::thread([&, i]{
      for (int round_id = i; round_id < round; round_id += thread_num) {
        auto mktsegmentCondition = argv[5 + round_id * 4][0];
        auto orderdateCondition = util::DateToInt(argv[5 + round_id * 4 + 1]);
        auto shipdateCondition = util::DateToInt(argv[5 + round_id * 4 + 2]);
        auto topn = std::stoi(argv[5 + round_id * 4 + 3]);
        results[round_id] = tpch.query(mktsegmentCondition, orderdateCondition, shipdateCondition, topn);
      }
    });
  }

  for (auto &t : threads) {
    t.join();
  }

  for (auto &r : results) {
    printf("%s", r);
  }

  return 0;
}